

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::ItemAdd(ImRect *bb,ImGuiID id,ImRect *nav_bb_arg)

{
  int *piVar1;
  ImGuiItemStatusFlags *pIVar2;
  ImRect *pIVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  uint uVar9;
  ImGuiNavLayer IVar10;
  ImGuiWindow *pIVar11;
  ImGuiWindow *pIVar12;
  ImRect cand;
  ImRect cand_00;
  ImVec2 IVar13;
  ImGuiContext *pIVar14;
  bool bVar15;
  bool bVar16;
  ImGuiID IVar17;
  undefined4 in_register_00000034;
  ImGuiNavMoveResult *pIVar18;
  ImGuiContext *g;
  ImGui *this;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  
  pIVar14 = GImGui;
  pIVar18 = (ImGuiNavMoveResult *)CONCAT44(in_register_00000034,id);
  pIVar11 = GImGui->CurrentWindow;
  if (id != 0) {
    piVar1 = &(pIVar11->DC).NavLayerActiveMaskNext;
    *piVar1 = *piVar1 | (pIVar11->DC).NavLayerCurrentMask;
    IVar17 = pIVar14->NavId;
    if ((((IVar17 == id) || (pIVar14->NavAnyRequest == true)) &&
        (pIVar12 = pIVar14->NavWindow, pIVar12->RootWindowForNav == pIVar11->RootWindowForNav)) &&
       ((pIVar11 == pIVar12 || (((uint)(pIVar12->Flags | pIVar11->Flags) >> 0x17 & 1) != 0)))) {
      if (nav_bb_arg == (ImRect *)0x0) {
        nav_bb_arg = bb;
      }
      uVar9 = (pIVar11->DC).ItemFlags;
      uVar7 = ((ImGuiNavMoveResult *)nav_bb_arg)->ID;
      uVar8 = ((ImGuiNavMoveResult *)nav_bb_arg)->FocusScopeId;
      fVar19 = (pIVar11->Pos).x;
      fVar23 = SUB84(((ImGuiNavMoveResult *)nav_bb_arg)->Window,0) - fVar19;
      fVar20 = (pIVar11->Pos).y;
      fVar24 = (float)((ulong)((ImGuiNavMoveResult *)nav_bb_arg)->Window >> 0x20) - fVar20;
      fVar19 = (float)uVar7 - fVar19;
      fVar20 = (float)uVar8 - fVar20;
      if ((pIVar14->NavInitRequest == true) && (pIVar14->NavLayer == (pIVar11->DC).NavLayerCurrent))
      {
        if ((uVar9 & 0x10) == 0) {
          pIVar14->NavInitResultId = id;
          (pIVar14->NavInitResultRectRel).Min.x = fVar23;
          (pIVar14->NavInitResultRectRel).Min.y = fVar24;
          (pIVar14->NavInitResultRectRel).Max.x = fVar19;
          (pIVar14->NavInitResultRectRel).Max.y = fVar20;
          pIVar14->NavInitRequest = false;
          NavUpdateAnyRequestFlag();
          IVar17 = pIVar14->NavId;
        }
        else if (pIVar14->NavInitResultId == 0) {
          pIVar14->NavInitResultId = id;
          (pIVar14->NavInitResultRectRel).Min.x = fVar23;
          (pIVar14->NavInitResultRectRel).Min.y = fVar24;
          (pIVar14->NavInitResultRectRel).Max.x = fVar19;
          (pIVar14->NavInitResultRectRel).Max.y = fVar20;
        }
      }
      if (((IVar17 != id) || ((pIVar14->NavMoveRequestFlags & 0x10) != 0)) && ((uVar9 & 0xc) == 0))
      {
        this = (ImGui *)&pIVar14->NavMoveResultOther;
        if (pIVar14->NavWindow == pIVar11) {
          this = (ImGui *)&pIVar14->NavMoveResultLocal;
        }
        if ((pIVar14->NavMoveRequest == true) &&
           (cand.Min = (ImVec2)((ImGuiNavMoveResult *)nav_bb_arg)->Window,
           cand.Max.x = (float)((ImGuiNavMoveResult *)nav_bb_arg)->ID,
           cand.Max.y = (float)((ImGuiNavMoveResult *)nav_bb_arg)->FocusScopeId,
           bVar15 = NavScoreItem(this,pIVar18,cand), bVar15)) {
          *(ImGuiWindow **)this = pIVar11;
          *(ImGuiID *)(this + 8) = id;
          *(ImGuiID *)(this + 0xc) = (pIVar11->DC).NavFocusScopeIdCurrent;
          *(float *)(this + 0x1c) = fVar23;
          *(float *)(this + 0x20) = fVar24;
          *(float *)(this + 0x24) = fVar19;
          *(float *)(this + 0x28) = fVar20;
        }
        if (((pIVar14->NavMoveRequestFlags & 0x20) != 0) &&
           (pIVar18 = (ImGuiNavMoveResult *)nav_bb_arg,
           bVar15 = ImRect::Overlaps(&pIVar11->ClipRect,nav_bb_arg), bVar15)) {
          fVar4 = *(float *)((long)&((ImGuiNavMoveResult *)nav_bb_arg)->Window + 4);
          fVar5 = (float)((ImGuiNavMoveResult *)nav_bb_arg)->FocusScopeId;
          fVar6 = (pIVar11->ClipRect).Min.y;
          fVar21 = (pIVar11->ClipRect).Max.y;
          fVar22 = fVar21;
          if (fVar5 <= fVar21) {
            fVar22 = fVar5;
          }
          if (fVar4 <= fVar21) {
            fVar21 = fVar4;
          }
          if (((fVar5 - fVar4) * 0.7 <=
               (float)(-(uint)(fVar5 < fVar6) & (uint)fVar6 | ~-(uint)(fVar5 < fVar6) & (uint)fVar22
                      ) -
               (float)(-(uint)(fVar4 < fVar6) & (uint)fVar6 | ~-(uint)(fVar4 < fVar6) & (uint)fVar21
                      )) &&
             (cand_00.Min = (ImVec2)((ImGuiNavMoveResult *)nav_bb_arg)->Window,
             cand_00.Max.x = (float)((ImGuiNavMoveResult *)nav_bb_arg)->ID,
             cand_00.Max.y = (float)((ImGuiNavMoveResult *)nav_bb_arg)->FocusScopeId,
             bVar15 = NavScoreItem((ImGui *)&pIVar14->NavMoveResultLocalVisibleSet,pIVar18,cand_00),
             bVar15)) {
            (pIVar14->NavMoveResultLocalVisibleSet).Window = pIVar11;
            (pIVar14->NavMoveResultLocalVisibleSet).ID = id;
            (pIVar14->NavMoveResultLocalVisibleSet).FocusScopeId =
                 (pIVar11->DC).NavFocusScopeIdCurrent;
            (pIVar14->NavMoveResultLocalVisibleSet).RectRel.Min.x = fVar23;
            (pIVar14->NavMoveResultLocalVisibleSet).RectRel.Min.y = fVar24;
            (pIVar14->NavMoveResultLocalVisibleSet).RectRel.Max.x = fVar19;
            (pIVar14->NavMoveResultLocalVisibleSet).RectRel.Max.y = fVar20;
          }
        }
      }
      if (pIVar14->NavId == id) {
        pIVar14->NavWindow = pIVar11;
        IVar10 = (pIVar11->DC).NavLayerCurrent;
        pIVar14->NavLayer = IVar10;
        pIVar14->NavFocusScopeId = (pIVar11->DC).NavFocusScopeIdCurrent;
        pIVar14->NavIdIsAlive = true;
        pIVar14->NavIdTabCounter = (pIVar11->DC).FocusCounterTabStop;
        pIVar3 = pIVar11->NavRectRel + IVar10;
        (pIVar3->Min).x = fVar23;
        (pIVar3->Min).y = fVar24;
        (pIVar3->Max).x = fVar19;
        (pIVar3->Max).y = fVar20;
      }
    }
  }
  (pIVar11->DC).LastItemId = id;
  IVar13 = bb->Max;
  (pIVar11->DC).LastItemRect.Min = bb->Min;
  (pIVar11->DC).LastItemRect.Max = IVar13;
  (pIVar11->DC).LastItemStatusFlags = 0;
  (pIVar14->NextItemData).Flags = 0;
  bVar15 = IsClippedEx(bb,id,false);
  if ((!bVar15) && (bVar16 = IsMouseHoveringRect(&bb->Min,&bb->Max,true), bVar16)) {
    pIVar2 = &(pIVar11->DC).LastItemStatusFlags;
    *(byte *)pIVar2 = (byte)*pIVar2 | 1;
  }
  return !bVar15;
}

Assistant:

bool ImGui::ItemAdd(const ImRect& bb, ImGuiID id, const ImRect* nav_bb_arg)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (id != 0)
    {
        // Navigation processing runs prior to clipping early-out
        //  (a) So that NavInitRequest can be honored, for newly opened windows to select a default widget
        //  (b) So that we can scroll up/down past clipped items. This adds a small O(N) cost to regular navigation requests
        //      unfortunately, but it is still limited to one window. It may not scale very well for windows with ten of
        //      thousands of item, but at least NavMoveRequest is only set on user interaction, aka maximum once a frame.
        //      We could early out with "if (is_clipped && !g.NavInitRequest) return false;" but when we wouldn't be able
        //      to reach unclipped widgets. This would work if user had explicit scrolling control (e.g. mapped on a stick).
        // We intentionally don't check if g.NavWindow != NULL because g.NavAnyRequest should only be set when it is non null.
        // If we crash on a NULL g.NavWindow we need to fix the bug elsewhere.
        window->DC.NavLayerActiveMaskNext |= window->DC.NavLayerCurrentMask;
        if (g.NavId == id || g.NavAnyRequest)
            if (g.NavWindow->RootWindowForNav == window->RootWindowForNav)
                if (window == g.NavWindow || ((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened))
                    NavProcessItem(window, nav_bb_arg ? *nav_bb_arg : bb, id);

        // [DEBUG] Item Picker tool, when enabling the "extended" version we perform the check in ItemAdd()
#ifdef IMGUI_DEBUG_TOOL_ITEM_PICKER_EX
        if (id == g.DebugItemPickerBreakId)
        {
            IM_DEBUG_BREAK();
            g.DebugItemPickerBreakId = 0;
        }
#endif
    }

    window->DC.LastItemId = id;
    window->DC.LastItemRect = bb;
    window->DC.LastItemStatusFlags = ImGuiItemStatusFlags_None;
    g.NextItemData.Flags = ImGuiNextItemDataFlags_None;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0)
        IMGUI_TEST_ENGINE_ITEM_ADD(nav_bb_arg ? *nav_bb_arg : bb, id);
#endif

    // Clipping test
    const bool is_clipped = IsClippedEx(bb, id, false);
    if (is_clipped)
        return false;
    //if (g.IO.KeyAlt) window->DrawList->AddRect(bb.Min, bb.Max, IM_COL32(255,255,0,120)); // [DEBUG]

    // We need to calculate this now to take account of the current clipping rectangle (as items like Selectable may change them)
    if (IsMouseHoveringRect(bb.Min, bb.Max))
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_HoveredRect;
    return true;
}